

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall
CServerBrowser::SetFavoritePassword(CServerBrowser *this,char *pAddress,char *pPassword)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  CServerBrowser *in_RDX;
  CServerBrowserFilter *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  CServerEntry *pEntry;
  int i;
  NETADDR Addr;
  CServerEntry *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  CServerBrowserFavorites *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CServerBrowserFavorites::AddFavoriteEx
                    (in_stack_ffffffffffffffe0,in_RDI,(NETADDR *)in_RSI,
                     SUB81((ulong)in_RDX >> 0x38,0),
                     (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (bVar2) {
    memset(&stack0xffffffffffffffe0,0,0x18);
    iVar3 = net_addr_from_str(&in_stack_ffffffffffffffb8->m_Addr,in_RDI);
    if (iVar3 == 0) {
      for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
        in_stack_ffffffffffffffb8 = Find(in_RDX,iVar3,&in_stack_ffffffffffffffb8->m_Addr);
        if ((in_stack_ffffffffffffffb8 != (CServerEntry *)0x0) &&
           ((in_stack_ffffffffffffffb8->m_Info).m_Favorite = true,
           iVar3 == *(int *)(in_RDI + 0xbdf0))) {
          CServerBrowserFilter::Sort(in_RSI,(CServerEntry **)in_RDX,iVar3,in_stack_ffffffffffffffc0)
          ;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CServerBrowser::SetFavoritePassword(const char *pAddress, const char *pPassword)
{
	if(m_ServerBrowserFavorites.AddFavoriteEx(pAddress, 0, false, pPassword))
	{
		NETADDR Addr = {0};
		if(net_addr_from_str(&Addr, pAddress))
			return;
		for(int i = 0; i < NUM_TYPES; ++i)
		{
			CServerEntry *pEntry = Find(i, Addr);
			if(pEntry)
			{
				pEntry->m_Info.m_Favorite = true;

				// refresh servers in all filters where favorites are filtered
				if(i == m_ActServerlistType)
					m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FAV);
			}
		}
	}
}